

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O1

void __thiscall
jsonrpccxx::JsonRpcException::JsonRpcException(JsonRpcException *this,int code,string *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  uint uVar4;
  long *plVar5;
  uint uVar6;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  uint __val;
  uint __len;
  string __str;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  *(undefined ***)this = &PTR__JsonRpcException_001704e8;
  this->code = code;
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pcVar2 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message,pcVar2,pcVar2 + message->_M_string_length);
  (this->data).m_type = null;
  (this->data).m_value.object = (object_t *)0x0;
  __len = 1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&this->data,true);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&this->data,true);
  __val = -code;
  if (0 < code) {
    __val = code;
  }
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar6 = (uint)uVar9;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_0010ce6c;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_0010ce6c;
      }
      if (uVar6 < 10000) goto LAB_0010ce6c;
      uVar9 = uVar9 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_0010ce6c:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(code >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)code >> 0x1f) + (long)local_50[0]),__len,__val);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(message->_M_dataplus)._M_p);
  paVar1 = &(this->err).field_2;
  (this->err)._M_dataplus._M_p = (pointer)paVar1;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    lVar3 = plVar5[3];
    paVar1->_M_allocated_capacity = *psVar8;
    *(long *)((long)&(this->err).field_2 + 8) = lVar3;
  }
  else {
    (this->err)._M_dataplus._M_p = (pointer)*plVar5;
    (this->err).field_2._M_allocated_capacity = *psVar8;
  }
  (this->err)._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

JsonRpcException(int code, const std::string &message) noexcept : code(code), message(message), data(nullptr), err(std::to_string(code) + ": " + message) {}